

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ExpandDimsLayerParams::ExpandDimsLayerParams
          (ExpandDimsLayerParams *this,Arena *arena,bool is_message_owned)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::InternalMetadata
            (&(this->super_MessageLite)._internal_metadata_,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ExpandDimsLayerParams_0048bd08;
  (this->axes_).current_size_ = 0;
  (this->axes_).total_size_ = 0;
  (this->axes_).arena_or_elements_ = arena;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

ExpandDimsLayerParams::ExpandDimsLayerParams(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  axes_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.ExpandDimsLayerParams)
}